

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall CS248::Camera::moveBy(Camera *this,double dx,double dy,double d)

{
  Vector3D *in_RDI;
  Vector3D *this_00;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  Vector3D *displacement;
  double scaleFactor;
  Vector3D *in_stack_ffffffffffffff78;
  Vector3D local_48;
  Vector3D *local_30;
  double local_28;
  double local_18;
  
  local_28 = in_XMM2_Qa / in_RDI[9].x;
  local_18 = in_XMM1_Qa;
  Matrix3x3::operator[]((Matrix3x3 *)&in_RDI[5].y,0);
  Vector3D::operator*(in_stack_ffffffffffffff78,&in_RDI->x);
  Matrix3x3::operator[]((Matrix3x3 *)&in_RDI[5].y,1);
  this_00 = (Vector3D *)(local_18 * local_28);
  Vector3D::operator*(this_00,&in_RDI->x);
  Vector3D::operator+(this_00,in_RDI);
  local_30 = &local_48;
  Vector3D::operator+=((Vector3D *)&in_RDI[1].z,local_30);
  Vector3D::operator+=((Vector3D *)&in_RDI[2].z,local_30);
  return;
}

Assistant:

void Camera::moveBy(const double dx, const double dy, const double d) {
    const double scaleFactor = d / screenDist;
    const Vector3D& displacement = c2w[0] * (dx * scaleFactor) + c2w[1] * (dy * scaleFactor);
    pos += displacement;
    targetPos += displacement;
}